

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O2

void __thiscall
tcu::TestNode::getChildren
          (TestNode *this,vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *res)

{
  pointer ppTVar1;
  int i;
  long lVar2;
  long lVar3;
  
  ppTVar1 = (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppTVar1) {
    (res->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppTVar1;
  }
  lVar3 = 0;
  for (lVar2 = 0;
      ppTVar1 = (this->m_children).
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->m_children).
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3);
      lVar2 = lVar2 + 1) {
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              (res,(value_type *)((long)ppTVar1 + lVar3));
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

void TestNode::getChildren (vector<TestNode*>& res)
{
	res.clear();
	for (int i = 0; i < (int)m_children.size(); i++)
		res.push_back(m_children[i]);
}